

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

QString * __thiscall QMessageBox::buttonText(QMessageBox *this,int button)

{
  long lVar1;
  bool bVar2;
  QAbstractButton *pQVar3;
  int in_EDX;
  QAbstractButton *in_RDI;
  long in_FS_OFFSET;
  QAbstractButton *abstractButton;
  QMessageBoxPrivate *d;
  int in_stack_ffffffffffffff9c;
  undefined5 in_stack_ffffffffffffffa0;
  byte bVar4;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar5;
  QAbstractButton *pQVar6;
  QMessageBoxPrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  d_func((QMessageBox *)0x7a83bb);
  pQVar3 = QMessageBoxPrivate::abstractButtonForId
                     (in_stack_ffffffffffffffb8,(int)((ulong)pQVar6 >> 0x20));
  if (pQVar3 == (QAbstractButton *)0x0) {
    QDialogButtonBox::buttons((QDialogButtonBox *)in_RDI);
    bVar2 = QList<QAbstractButton_*>::isEmpty((QList<QAbstractButton_*> *)0x7a840f);
    if (bVar2) {
      in_stack_ffffffffffffffa6 = in_EDX == 0x400 || in_EDX == 1;
    }
    bVar4 = bVar2 && (in_EDX == 0x400 || in_EDX == 1);
    uVar5 = bVar4;
    QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x7a8454);
    if ((bVar4 & 1) == 0) {
      QString::QString((QString *)0x7a8486);
    }
    else {
      QDialogButtonBox::tr
                ((char *)in_RDI,
                 (char *)CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffa6,
                                                 CONCAT15(bVar4,in_stack_ffffffffffffffa0))),
                 in_stack_ffffffffffffff9c);
    }
  }
  else {
    QAbstractButton::text(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QString QMessageBox::buttonText(int button) const
{
    Q_D(const QMessageBox);

    if (QAbstractButton *abstractButton = d->abstractButtonForId(button)) {
        return abstractButton->text();
    } else if (d->buttonBox->buttons().isEmpty() && (button == Ok || button == Old_Ok)) {
        // for compatibility with Qt 4.0/4.1
        return QDialogButtonBox::tr("OK");
    }
    return QString();
}